

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFScc<(moira::Instr)199,(moira::Mode)8,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Ea<(moira::Mode)8,_1> result;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar2 = (*this->_vptr_Moira[6])();
  if ((0x1f < (ushort)uVar2) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)199,(moira::Mode)8,1>(this,str,addr,op);
    return;
  }
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = 'f';
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = 's';
  StrWriter::operator<<(str,(Fcc)(uVar2 & 0x3f));
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar3 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar3);
  }
  local_3c = *addr;
  *addr = local_3c + 2;
  local_38 = op & 7;
  iVar3 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar2 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar2 & 0xffff | iVar3 << 0x10;
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_1> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmFScc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto cnd = __________xxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Fcc{cnd} << str.tab << Op<M, S>(reg, addr);
}